

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

ostream * molly::operator<<(ostream *os,DeviceState *state)

{
  DeviceState DVar1;
  char *pcVar2;
  
  DVar1 = *state;
  if (DVar1 == Unknown) {
    pcVar2 = "Unknown";
  }
  else if (DVar1 == LidOpen) {
    pcVar2 = "LidOpen";
  }
  else if (DVar1 == LidClosed) {
    pcVar2 = "LidClosed";
  }
  else if (DVar1 == ButtonPressed) {
    pcVar2 = "ButtonPressed";
  }
  else {
    if (DVar1 != Unavailable) {
      return os;
    }
    pcVar2 = "Unavailable";
  }
  std::operator<<(os,pcVar2);
  return os;
}

Assistant:

std::ostream& molly::operator<<(std::ostream& os, DeviceState const& state)
{
  switch (state)
  {
    case DeviceState::Unknown:       os << "Unknown";       break;
    case DeviceState::Unavailable:   os << "Unavailable";   break;
    case DeviceState::LidClosed:     os << "LidClosed";     break;
    case DeviceState::ButtonPressed: os << "ButtonPressed"; break;
    case DeviceState::LidOpen:       os << "LidOpen";       break;
  }
  return os;
}